

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O1

int WebRtcIsac_DecodeSpec
              (Bitstr *streamdata,int16_t AvgPitchGain_Q12,ISACBand band,double *fr,double *fi)

{
  uint uVar1;
  int16_t iVar2;
  int k;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int32_t num;
  uint32_t seed;
  bool bVar11;
  int16_t RCQ15 [6];
  int16_t ARCoefQ12 [7];
  int16_t data [480];
  uint16_t invARSpecQ8 [120];
  int32_t invARSpec2_Q16 [120];
  int16_t DitherQ7 [480];
  int local_aac;
  ushort local_aa8;
  int16_t local_aa2 [6];
  int16_t local_a96 [7];
  undefined4 local_a88;
  short asStack_a84 [598];
  uint local_5d8 [120];
  int16_t local_3f8 [484];
  
  seed = streamdata->W_upper;
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(local_3f8,seed,(int)AvgPitchGain_Q12,(int16_t)fr);
    local_aac = 0x1e0;
    local_aa8 = 0;
  }
  else {
    lVar6 = 0;
    do {
      iVar8 = seed * 0xbb38435;
      seed = iVar8 + 0x3619636b;
      local_3f8[lVar6] = (short)(iVar8 + 0x3719636b >> 0x1b);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1e0);
    local_aa8 = (ushort)(band == kIsacUpperBand12);
    local_aac = 0x1e0;
    if (band == kIsacUpperBand12) {
      local_aac = 0xf0;
    }
  }
  iVar3 = WebRtcIsac_DecodeRc(streamdata,local_aa2);
  iVar8 = -0x1a22;
  if (-1 < iVar3) {
    WebRtcSpl_ReflCoefToLpc(local_aa2,6,local_a96);
    iVar3 = WebRtcIsac_DecHistOneStepMulti
                      (&local_a88,streamdata,WebRtcIsac_kQGainCdf_ptr,WebRtcIsac_kQGainInitIndex,1);
    if (-1 < iVar3) {
      FindInvArSpec(local_a96,WebRtcIsac_kQGain2Levels[local_a88],(int32_t *)local_5d8);
      iVar3 = (uint)(0xffff < local_5d8[0]) * 0x10;
      iVar8 = iVar3 + 8;
      if ((local_5d8[0] >> (sbyte)iVar3 & 0xff00) == 0) {
        iVar8 = iVar3;
      }
      iVar3 = iVar8 + 4;
      if ((local_5d8[0] >> ((byte)iVar8 & 0x1f) & 0xf0) == 0) {
        iVar3 = iVar8;
      }
      iVar8 = iVar3 + 2;
      if ((local_5d8[0] >> ((byte)iVar3 & 0x1f) & 0xc) == 0) {
        iVar8 = iVar3;
      }
      uVar10 = (local_5d8[0] >> ((byte)iVar8 & 0x1f) & 2) >> 1;
      uVar10 = 1 << ((byte)((ushort)((short)uVar10 + (short)iVar8 +
                                    (ushort)((local_5d8[0] >> (uVar10 + iVar8 & 0x1f) & 1) != 0)) >>
                           1) & 0x1f);
      lVar6 = 0;
      do {
        uVar4 = local_5d8[lVar6];
        uVar1 = -uVar4;
        if (0 < (int)uVar4) {
          uVar1 = uVar4;
        }
        uVar4 = uVar1 / uVar10 + uVar10 >> 1;
        iVar8 = -10;
        do {
          uVar10 = uVar4;
          uVar4 = uVar1 / uVar10 + uVar10 >> 1;
          if (uVar4 == uVar10) break;
          bVar11 = iVar8 != 0;
          iVar8 = iVar8 + 1;
        } while (bVar11);
        asStack_a84[lVar6 + 0x1de] = (short)uVar4;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x78);
      iVar3 = WebRtcIsac_DecLogisticMulti2
                        ((int16_t *)&local_a88,streamdata,(uint16_t *)(asStack_a84 + 0x1de),
                         local_3f8,local_aac,local_aa8);
      iVar8 = -0x1a22;
      if (0 < iVar3) {
        iVar8 = iVar3;
        if (band == kIsacLowerBand) {
          num = 0x9000;
          if (AvgPitchGain_Q12 < 0x267) {
            num = 0x7800;
          }
          iVar3 = 0x288000;
          if (AvgPitchGain_Q12 < 0x267) {
            iVar3 = 0x218000;
          }
          uVar7 = 0xfffffffffffffffc;
          do {
            iVar2 = WebRtcSpl_DivW32W16ResW16
                              (num,(int16_t)((uint)(*(int *)((long)local_5d8 + uVar7 + 4) + iVar3)
                                            >> 0x10));
            iVar5 = (int)iVar2;
            *(double *)((long)fr + uVar7 * 4 + 0x10) =
                 (double)(asStack_a84[uVar7 + 2] * iVar5 + 0x200 >> 10) * 0.0078125;
            *(double *)((long)fi + uVar7 * 4 + 0x10) =
                 (double)(asStack_a84[uVar7 + 3] * iVar5 + 0x200 >> 10) * 0.0078125;
            *(double *)((long)fr + uVar7 * 4 + 0x18) =
                 (double)(asStack_a84[uVar7 + 4] * iVar5 + 0x200 >> 10) * 0.0078125;
            *(double *)((long)fi + uVar7 * 4 + 0x18) =
                 (double)(asStack_a84[uVar7 + 5] * iVar5 + 0x200 >> 10) * 0.0078125;
            uVar7 = uVar7 + 4;
          } while (uVar7 < 0x1dc);
        }
        else if (band == kIsacUpperBand12) {
          uVar7 = 0xfffffffffffffffc;
          do {
            *(double *)((long)fr + uVar7 * 4 + 0x10) =
                 (double)(int)asStack_a84[uVar7 + 2] * 0.0078125;
            *(double *)((long)fi + uVar7 * 4 + 0x10) =
                 (double)(int)asStack_a84[uVar7 + 3] * 0.0078125;
            *(double *)((long)fr + uVar7 * 4 + 0x18) =
                 (double)(int)asStack_a84[uVar7 + 4] * 0.0078125;
            *(double *)((long)fi + uVar7 * 4 + 0x18) =
                 (double)(int)asStack_a84[uVar7 + 5] * 0.0078125;
            uVar7 = uVar7 + 4;
          } while (uVar7 < 0xec);
          memset(fr + 0x78,0,0x3c0);
          memset(fi + 0x78,0,0x3c0);
        }
        else if (band == kIsacUpperBand16) {
          lVar6 = 0x778;
          lVar9 = 0;
          do {
            *(double *)((long)fr + lVar9) =
                 (double)(int)*(short *)((long)&local_a88 + lVar9) * 0.0078125;
            *(double *)((long)fi + lVar9) =
                 (double)(int)*(short *)((long)&local_a88 + lVar9 + 2) * 0.0078125;
            *(double *)((long)fr + lVar6) =
                 (double)(int)*(short *)((long)asStack_a84 + lVar9) * 0.0078125;
            *(double *)((long)fi + lVar6) =
                 (double)(int)*(short *)((long)asStack_a84 + lVar9 + 2) * 0.0078125;
            lVar9 = lVar9 + 8;
            lVar6 = lVar6 + -8;
          } while (lVar9 != 0x3c0);
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int WebRtcIsac_DecodeSpec(Bitstr* streamdata, int16_t AvgPitchGain_Q12,
                          enum ISACBand band, double* fr, double* fi) {
  int16_t  DitherQ7[FRAMESAMPLES];
  int16_t  data[FRAMESAMPLES];
  int32_t  invARSpec2_Q16[FRAMESAMPLES_QUARTER];
  uint16_t invARSpecQ8[FRAMESAMPLES_QUARTER];
  int16_t  ARCoefQ12[AR_ORDER + 1];
  int16_t  RCQ15[AR_ORDER];
  int16_t  gainQ10;
  int32_t  gain2_Q10, res;
  int32_t  in_sqrt;
  int32_t  newRes;
  int k, len, i;
  int is_12khz = !kIsSWB12;
  int num_dft_coeff = FRAMESAMPLES;
  /* Create dither signal. */
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(DitherQ7, streamdata->W_upper, FRAMESAMPLES,
                       AvgPitchGain_Q12);
  } else {
    GenerateDitherQ7LbUB(DitherQ7, streamdata->W_upper, FRAMESAMPLES);
    if (band == kIsacUpperBand12) {
      is_12khz = kIsSWB12;
      num_dft_coeff = FRAMESAMPLES_HALF;
    }
  }

  /* Decode model parameters. */
  if (WebRtcIsac_DecodeRc(streamdata, RCQ15) < 0)
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;

  WebRtcSpl_ReflCoefToLpc(RCQ15, AR_ORDER, ARCoefQ12);

  if (WebRtcIsac_DecodeGain2(streamdata, &gain2_Q10) < 0)
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;

  /* Compute inverse AR power spectrum. */
  FindInvArSpec(ARCoefQ12, gain2_Q10, invARSpec2_Q16);

  /* Convert to magnitude spectrum,
   * by doing square-roots (modified from SPLIB). */
  res = 1 << (WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]) >> 1);
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    in_sqrt = invARSpec2_Q16[k];
    i = 10;

    /* Negative values make no sense for a real sqrt-function. */
    if (in_sqrt < 0)
      in_sqrt = -in_sqrt;

    newRes = (in_sqrt / res + res) >> 1;
    do {
      res = newRes;
      newRes = (in_sqrt / res + res) >> 1;
    } while (newRes != res && i-- > 0);

    invARSpecQ8[k] = (int16_t)newRes;
  }

  len = WebRtcIsac_DecLogisticMulti2(data, streamdata, invARSpecQ8, DitherQ7,
                                     num_dft_coeff, is_12khz);
  /* Arithmetic decoding of spectrum. */
  if (len < 1) {
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;
  }

  switch (band) {
    case kIsacLowerBand: {
      /* Scale down spectral samples with low SNR. */
      int32_t p1;
      int32_t p2;
      if (AvgPitchGain_Q12 <= 614) {
        p1 = 30 << 10;
        p2 = 32768 + (33 << 16);
      } else {
        p1 = 36 << 10;
        p2 = 32768 + (40 << 16);
      }
      for (k = 0; k < FRAMESAMPLES; k += 4) {
        gainQ10 = WebRtcSpl_DivW32W16ResW16(p1, (int16_t)(
            (invARSpec2_Q16[k >> 2] + p2) >> 16));
        *fr++ = (double)((data[ k ] * gainQ10 + 512) >> 10) / 128.0;
        *fi++ = (double)((data[k + 1] * gainQ10 + 512) >> 10) / 128.0;
        *fr++ = (double)((data[k + 2] * gainQ10 + 512) >> 10) / 128.0;
        *fi++ = (double)((data[k + 3] * gainQ10 + 512) >> 10) / 128.0;
      }
      break;
    }
    case kIsacUpperBand12: {
      for (k = 0, i = 0; k < FRAMESAMPLES_HALF; k += 4) {
        fr[i] = (double)data[ k ] / 128.0;
        fi[i] = (double)data[k + 1] / 128.0;
        i++;
        fr[i] = (double)data[k + 2] / 128.0;
        fi[i] = (double)data[k + 3] / 128.0;
        i++;
      }
      /* The second half of real and imaginary coefficients is zero. This is
       * due to using the old FFT module which requires two signals as input
       * while in 0-12 kHz mode we only have 8-12 kHz band, and the second
       * signal is set to zero. */
      memset(&fr[FRAMESAMPLES_QUARTER], 0, FRAMESAMPLES_QUARTER *
             sizeof(double));
      memset(&fi[FRAMESAMPLES_QUARTER], 0, FRAMESAMPLES_QUARTER *
             sizeof(double));
      break;
    }
    case kIsacUpperBand16: {
      for (i = 0, k = 0; k < FRAMESAMPLES; k += 4, i++) {
        fr[i] = (double)data[ k ] / 128.0;
        fi[i] = (double)data[k + 1] / 128.0;
        fr[(FRAMESAMPLES_HALF) - 1 - i] = (double)data[k + 2] / 128.0;
        fi[(FRAMESAMPLES_HALF) - 1 - i] = (double)data[k + 3] / 128.0;
      }
      break;
    }
  }
  return len;
}